

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

int __thiscall cmCTestTestHandler::PostProcessHandler(cmCTestTestHandler *this)

{
  cmCTest *this_00;
  int iVar1;
  int iVar2;
  ostringstream cmCTestLog_msg;
  long *local_1a8;
  long local_198 [2];
  long local_188 [14];
  ios_base local_118 [264];
  
  iVar1 = ExecuteCommands(this,&this->CustomPostTest);
  iVar2 = 1;
  if (iVar1 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Problem executing post-test command(s).",0x27);
    std::ios::widen((char)(ostringstream *)local_188 + (char)*(undefined8 *)(local_188[0] + -0x18));
    std::ostream::put((char)local_188);
    std::ostream::flush();
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x184,(char *)local_1a8,false);
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int cmCTestTestHandler::PostProcessHandler()
{
  if (!this->ExecuteCommands(this->CustomPostTest)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Problem executing post-test command(s)." << std::endl);
    return 0;
  }
  return 1;
}